

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CoverpointSymbol::serializeTo(CoverpointSymbol *this,ASTSerializer *serializer)

{
  size_t sVar1;
  Expression *pEVar2;
  long lVar3;
  CoverageOptionSetter *opt;
  pointer this_00;
  string_view name;
  
  if ((this->options)._M_extent._M_extent_value != 0) {
    name._M_str = "options";
    name._M_len = 7;
    ASTSerializer::startArray(serializer,name);
    sVar1 = (this->options)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      this_00 = (this->options)._M_ptr;
      lVar3 = sVar1 * 0x18;
      do {
        ASTSerializer::startObject(serializer);
        pEVar2 = CoverageOptionSetter::getExpression(this_00);
        ASTSerializer::write(serializer,4,"expr",(size_t)pEVar2);
        ASTSerializer::endObject(serializer);
        this_00 = this_00 + 1;
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    ASTSerializer::endArray(serializer);
  }
  pEVar2 = getIffExpr(this);
  if (pEVar2 != (Expression *)0x0) {
    ASTSerializer::write(serializer,3,"iff",(size_t)pEVar2);
    return;
  }
  return;
}

Assistant:

void CoverpointSymbol::serializeTo(ASTSerializer& serializer) const {
    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options) {
            serializer.startObject();
            opt.serializeTo(serializer);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}